

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O2

fdb_compact_decision
cb_inmem_snap(fdb_file_handle *fhandle,fdb_compaction_status status,char *kv_name,fdb_doc *doc_in,
             uint64_t old_offset,uint64_t new_offset,void *ctx)

{
  void *pvVar1;
  fdb_kvs_handle *pfVar2;
  fdb_status fVar3;
  int iVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  size_t sVar8;
  fdb_doc *pfVar9;
  fdb_iterator *fit;
  fdb_kvs_handle *snap;
  fdb_doc *doc;
  ulong local_290;
  size_t valuelen;
  void *value_out;
  fdb_kvs_info info;
  timeval __test_begin;
  char value [256];
  char key [256];
  
  uVar7 = 0;
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  if (status == 2) {
    if (kv_name == (char *)0x0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x5d0);
      __assert_fail("kv_name",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x5d0,
                    "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                   );
    }
    uVar7 = (ulong)doc_in->deleted;
    iVar4 = *(int *)((long)ctx + 0xc);
    *(int *)((long)ctx + 0xc) = iVar4 + 1;
    local_290 = uVar7;
    if (iVar4 == 4) {
      builtin_strncpy(key,"new_key",8);
      builtin_strncpy(value,"new_value",10);
      pfVar2 = *ctx;
      sVar8 = strlen(key);
      sVar5 = strlen(value);
      fVar3 = fdb_set_kv(pfVar2,key,sVar8 + 1,value,sVar5 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x5ff);
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x5ff,
                      "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
      fVar3 = fdb_snapshot_open(*ctx,&snap,0xffffffffffffffff);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x603);
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x603,
                      "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
      fVar3 = fdb_get_kvs_info(snap,&info);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x606);
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x606,
                      "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
      if (info.last_seqnum != (long)*(int *)((long)ctx + 8) + 1U) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
               );
        if (info.last_seqnum != (long)*(int *)((long)ctx + 8) + 1U) {
          __assert_fail("info.last_seqnum == (fdb_seqnum_t)args->n+1",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x607,
                        "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
      }
      fVar3 = fdb_iterator_init(snap,&fit,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x60a);
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x60a,
                      "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
      uVar6 = 0;
      do {
        doc = (fdb_doc *)0x0;
        fVar3 = fdb_iterator_get(fit,&doc);
        pfVar9 = doc;
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        if ((int)uVar6 < *(int *)((long)ctx + 8)) {
          sprintf(key,*(char **)((long)ctx + 0x18),(ulong)uVar6);
          sVar8 = (size_t)*(int *)((long)ctx + 0x10);
          memset(value,0x78,sVar8);
          builtin_strncpy(value + (sVar8 - 6),"<end",4);
          (value + (sVar8 - 2))[0] = '>';
          (value + (sVar8 - 2))[1] = '\0';
          sprintf(value,*(char **)((long)ctx + 0x20),(ulong)uVar6);
          pfVar9 = doc;
          pvVar1 = doc->key;
          iVar4 = bcmp(pvVar1,key,doc->keylen);
          if (iVar4 != 0) {
            fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",key,pvVar1,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x619);
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x619,
                          "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                         );
          }
          pvVar1 = pfVar9->body;
          iVar4 = bcmp(pvVar1,value,pfVar9->bodylen);
          if (iVar4 != 0) {
            fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",value,pvVar1,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x61a);
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x61a,
                          "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                         );
          }
        }
        else {
          builtin_strncpy(key,"new_key",8);
          builtin_strncpy(value,"new_value",10);
          pvVar1 = doc->key;
          iVar4 = bcmp(pvVar1,key,doc->keylen);
          if (iVar4 != 0) {
            fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",key,pvVar1,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x61f);
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x61f,
                          "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                         );
          }
          pvVar1 = pfVar9->body;
          iVar4 = bcmp(pvVar1,value,pfVar9->bodylen);
          if (iVar4 != 0) {
            fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",value,pvVar1,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x620);
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x620,
                          "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                         );
          }
        }
        uVar6 = uVar6 + 1;
        fdb_doc_free(pfVar9);
        fVar3 = fdb_iterator_next(fit);
      } while (fVar3 == FDB_RESULT_SUCCESS);
      if (uVar6 != *(int *)((long)ctx + 8) + 1U) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x626);
        if (uVar6 != *(int *)((long)ctx + 8) + 1U) {
          __assert_fail("c == args->n + 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x626,
                        "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
      }
      fVar3 = fdb_iterator_close(fit);
      uVar7 = local_290;
      pfVar2 = snap;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x629);
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x629,
                      "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
      sVar8 = strlen(key);
      fVar3 = fdb_get_kv(pfVar2,key,sVar8 + 1,&value_out,&valuelen);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x62c);
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x62c,
                      "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
      iVar4 = bcmp(value_out,value,valuelen);
      if (iVar4 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",value,value_out,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x62d);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x62d,
                      "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
      fdb_free_block(value_out);
    }
    else {
      if (iVar4 != 1) goto LAB_0010b045;
      fVar3 = fdb_snapshot_open(*ctx,&snap,0xffffffffffffffff);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x5d8);
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x5d8,
                      "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
      fVar3 = fdb_get_kvs_info(snap,&info);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x5db);
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x5db,
                      "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
      if (info.last_seqnum != (long)*(int *)((long)ctx + 8)) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
               );
        if (info.last_seqnum != (long)*(int *)((long)ctx + 8)) {
          __assert_fail("info.last_seqnum == (fdb_seqnum_t)args->n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x5dc,
                        "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
      }
      fVar3 = fdb_iterator_init(snap,&fit,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x5df);
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x5df,
                      "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
      uVar7 = 0;
      do {
        uVar6 = (uint)uVar7;
        doc = (fdb_doc *)0x0;
        fVar3 = fdb_iterator_get(fit,&doc);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        sprintf(key,*(char **)((long)ctx + 0x18),uVar7);
        sVar8 = (size_t)*(int *)((long)ctx + 0x10);
        memset(value,0x78,sVar8);
        builtin_strncpy(value + (sVar8 - 6),"<end",4);
        (value + (sVar8 - 2))[0] = '>';
        (value + (sVar8 - 2))[1] = '\0';
        sprintf(value,*(char **)((long)ctx + 0x20),uVar7);
        pfVar9 = doc;
        pvVar1 = doc->key;
        iVar4 = bcmp(pvVar1,key,doc->keylen);
        if (iVar4 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",key,pvVar1,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x5ed);
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x5ed,
                        "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
        pvVar1 = pfVar9->body;
        iVar4 = bcmp(pvVar1,value,pfVar9->bodylen);
        if (iVar4 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",value,pvVar1,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x5ee);
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x5ee,
                        "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
        uVar6 = uVar6 + 1;
        uVar7 = (ulong)uVar6;
        fdb_doc_free(pfVar9);
        fVar3 = fdb_iterator_next(fit);
      } while (fVar3 == FDB_RESULT_SUCCESS);
      if (uVar6 != *(uint *)((long)ctx + 8)) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x5f3);
        if (uVar6 != *(uint *)((long)ctx + 8)) {
          __assert_fail("c == args->n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x5f3,
                        "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
      }
      fVar3 = fdb_iterator_close(fit);
      uVar7 = local_290;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x5f6);
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x5f6,
                      "fdb_compact_decision cb_inmem_snap(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
    }
    fdb_kvs_close(snap);
  }
LAB_0010b045:
  return (uint)uVar7 & 0xff;
}

Assistant:

static fdb_compact_decision cb_inmem_snap(fdb_file_handle *fhandle,
                            fdb_compaction_status status,
                            const char *kv_name,
                            fdb_doc *doc_in, uint64_t old_offset,
                            uint64_t new_offset,
                            void *ctx)
{
    TEST_INIT();
    int c, idx;
    char key[256], value[256];
    void *value_out;
    size_t valuelen;
    fdb_kvs_handle *snap;
    fdb_kvs_info info;
    fdb_iterator *fit;
    fdb_doc *doc;
    fdb_status s;
    fdb_compact_decision ret = FDB_CS_KEEP_DOC;
    struct cb_inmem_snap_args *args = (struct cb_inmem_snap_args *)ctx;
    (void)args;

    if (status == FDB_CS_MOVE_DOC) {
        TEST_CHK(kv_name);
        if (doc_in->deleted) {
            ret = FDB_CS_DROP_DOC;
        }
        args->move_count++;
        if (args->move_count == 2) {
            // open in-memory snapshot
            s = fdb_snapshot_open(args->handle, &snap, FDB_SNAPSHOT_INMEM);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            s = fdb_get_kvs_info(snap, &info);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            TEST_CHK(info.last_seqnum == (fdb_seqnum_t)args->n);

            s = fdb_iterator_init(snap, &fit, NULL, 0, NULL, 0, 0x0);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            c = 0;
            do {
                doc = NULL;
                s = fdb_iterator_get(fit, &doc);
                if (s != FDB_RESULT_SUCCESS) {
                    break;
                }
                idx = c;
                sprintf(key, args->keystr, idx);
                memset(value, 'x', args->value_len);
                memcpy(value + args->value_len - 6, "<end>", 6);
                sprintf(value, args->valuestr, idx);
                TEST_CMP(doc->key, key, doc->keylen);
                TEST_CMP(doc->body, value, doc->bodylen);

                c++;
                fdb_doc_free(doc);
            } while (fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
            TEST_CHK(c == args->n);

            s = fdb_iterator_close(fit);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            fdb_kvs_close(snap);

        } else if (args->move_count == 5) {
            // insert new doc
            sprintf(key, "new_key");
            sprintf(value, "new_value");
            s = fdb_set_kv(args->handle, (void*)key, strlen(key)+1, (void*)value, strlen(value)+1);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            // open in-memory snapshot
            s = fdb_snapshot_open(args->handle, &snap, FDB_SNAPSHOT_INMEM);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            s = fdb_get_kvs_info(snap, &info);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            TEST_CHK(info.last_seqnum == (fdb_seqnum_t)args->n+1);

            s = fdb_iterator_init(snap, &fit, NULL, 0, NULL, 0, 0x0);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            c = 0;
            do {
                doc = NULL;
                s = fdb_iterator_get(fit, &doc);
                if (s != FDB_RESULT_SUCCESS) {
                    break;
                }
                if (c < args->n) {
                    idx = c;
                    sprintf(key, args->keystr, idx);
                    memset(value, 'x', args->value_len);
                    memcpy(value + args->value_len - 6, "<end>", 6);
                    sprintf(value, args->valuestr, idx);
                    TEST_CMP(doc->key, key, doc->keylen);
                    TEST_CMP(doc->body, value, doc->bodylen);
                } else {
                    // new document
                    sprintf(key, "new_key");
                    sprintf(value, "new_value");
                    TEST_CMP(doc->key, key, doc->keylen);
                    TEST_CMP(doc->body, value, doc->bodylen);
                }

                c++;
                fdb_doc_free(doc);
            } while (fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
            TEST_CHK(c == args->n + 1);

            s = fdb_iterator_close(fit);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            s = fdb_get_kv(snap, (void*)key, strlen(key)+1, &value_out, &valuelen);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            TEST_CMP(value_out, value, valuelen);
            fdb_free_block(value_out);

            fdb_kvs_close(snap);
        }
    }
    return ret;
}